

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pthread.cpp
# Opt level: O2

void __thiscall booster::fork_shared_mutex::fork_shared_mutex(fork_shared_mutex *this)

{
  int iVar1;
  pthread_rwlock_t *ppVar2;
  FILE *pFVar3;
  int *piVar4;
  system_error *this_00;
  error_category *peVar5;
  
  ppVar2 = (pthread_rwlock_t *)operator_new(0x40);
  (this->d).ptr_ = (data *)ppVar2;
  pthread_rwlock_init(ppVar2,(pthread_rwlockattr_t *)0x0);
  pFVar3 = tmpfile();
  ppVar2 = (pthread_rwlock_t *)(this->d).ptr_;
  *(FILE **)(ppVar2->__size + 0x38) = pFVar3;
  if (pFVar3 != (FILE *)0x0) {
    return;
  }
  piVar4 = __errno_location();
  iVar1 = *piVar4;
  pthread_rwlock_destroy(ppVar2);
  this_00 = (system_error *)__cxa_allocate_exception(0x40);
  peVar5 = (error_category *)std::_V2::system_category();
  system::system_error::system_error
            (this_00,iVar1,peVar5,"fork_shared_mutex:failed to create temporary file");
  __cxa_throw(this_00,&system::system_error::typeinfo,system::system_error::~system_error);
}

Assistant:

fork_shared_mutex::fork_shared_mutex() : d(new data)
	{
		pthread_rwlock_init(&d->lock,0);
		d->lock_file = tmpfile();
		if(!d->lock_file) {
			int err=errno;
			pthread_rwlock_destroy(&d->lock);
			throw system::system_error(err,system::system_category(),"fork_shared_mutex:failed to create temporary file");
		}
	}